

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputConverter.cxx
# Opt level: O2

string * __thiscall
cmOutputConverter::Convert
          (string *__return_storage_ptr__,cmOutputConverter *this,string *source,
          RelativeRoot relative,OutputFormat output)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar1;
  cmState *pcVar2;
  Directory *this_00;
  string result;
  string sStack_88;
  Directory local_68;
  string local_40;
  
  std::__cxx11::string::string((string *)&sStack_88,(string *)source);
  switch(relative) {
  case FULL:
    cmsys::SystemTools::CollapseFullPath((string *)&local_68,&sStack_88);
    break;
  case HOME:
    pcVar2 = cmState::Snapshot::GetState(&this->StateSnapshot);
    pvVar1 = cmState::GetSourceDirectoryComponents_abi_cxx11_(pcVar2);
    ConvertToRelativePath((string *)&local_68,this,pvVar1,&sStack_88,false);
    break;
  case START:
    cmState::Snapshot::GetDirectory(&local_68,&this->StateSnapshot);
    pvVar1 = cmState::Directory::GetCurrentSourceComponents_abi_cxx11_(&local_68);
    ConvertToRelativePath(&local_40,this,pvVar1,&sStack_88,false);
    goto LAB_0034e1c4;
  case HOME_OUTPUT:
    pcVar2 = cmState::Snapshot::GetState(&this->StateSnapshot);
    pvVar1 = cmState::GetBinaryDirectoryComponents_abi_cxx11_(pcVar2);
    ConvertToRelativePath((string *)&local_68,this,pvVar1,&sStack_88,false);
    break;
  case START_OUTPUT:
    cmState::Snapshot::GetDirectory(&local_68,&this->StateSnapshot);
    pvVar1 = cmState::Directory::GetCurrentBinaryComponents_abi_cxx11_(&local_68);
    ConvertToRelativePath(&local_40,this,pvVar1,&sStack_88,false);
LAB_0034e1c4:
    this_00 = (Directory *)&local_40;
    goto LAB_0034e224;
  default:
    goto switchD_0034e154_default;
  }
  this_00 = &local_68;
LAB_0034e224:
  std::__cxx11::string::operator=((string *)&sStack_88,(string *)this_00);
  std::__cxx11::string::~string((string *)this_00);
switchD_0034e154_default:
  ConvertToOutputFormat(__return_storage_ptr__,this,&sStack_88,output);
  std::__cxx11::string::~string((string *)&sStack_88);
  return __return_storage_ptr__;
}

Assistant:

std::string cmOutputConverter::Convert(const std::string& source,
                                       RelativeRoot relative,
                                       OutputFormat output) const
{
  // Convert the path to a relative path.
  std::string result = source;

  switch (relative)
    {
  case HOME:
    result = this->ConvertToRelativePath(
          this->GetState()->GetSourceDirectoryComponents(), result);
    break;
  case START:
    result = this->ConvertToRelativePath(
          this->StateSnapshot.GetDirectory().GetCurrentSourceComponents(),
          result);
    break;
  case HOME_OUTPUT:
    result = this->ConvertToRelativePath(
          this->GetState()->GetBinaryDirectoryComponents(), result);
    break;
  case START_OUTPUT:
    result = this->ConvertToRelativePath(
          this->StateSnapshot.GetDirectory().GetCurrentBinaryComponents(),
          result);
    break;
  case FULL:
    result = cmSystemTools::CollapseFullPath(result);
    break;
  case NONE:
    break;
    }
  return this->ConvertToOutputFormat(result, output);
}